

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlBufferAddHead(void)

{
  int iVar1;
  int iVar2;
  xmlBufferPtr val;
  xmlChar *val_00;
  int local_3c;
  int local_38;
  int n_len;
  int len;
  int n_str;
  xmlChar *str;
  int n_buf;
  xmlBufferPtr buf;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (str._4_4_ = 0; (int)str._4_4_ < 3; str._4_4_ = str._4_4_ + 1) {
    for (n_len = 0; n_len < 5; n_len = n_len + 1) {
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_xmlBufferPtr(str._4_4_,0);
        val_00 = gen_const_xmlChar_ptr(n_len,1);
        local_38 = gen_int(local_3c,2);
        if (val_00 != (xmlChar *)0x0) {
          iVar2 = xmlStrlen(val_00);
          if (iVar2 < local_38) {
            local_38 = 0;
          }
        }
        iVar2 = xmlBufferAddHead(val,val_00,local_38);
        desret_int(iVar2);
        call_tests = call_tests + 1;
        des_xmlBufferPtr(str._4_4_,val,0);
        des_const_xmlChar_ptr(n_len,val_00,1);
        des_int(local_3c,local_38,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlBufferAddHead",(ulong)(uint)(iVar2 - iVar1));
          ret_val = ret_val + 1;
          printf(" %d",(ulong)str._4_4_);
          printf(" %d",(ulong)(uint)n_len);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlBufferAddHead(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlBufferPtr buf; /* the buffer */
    int n_buf;
    const xmlChar * str; /* the #xmlChar string */
    int n_str;
    int len; /* the number of #xmlChar to add */
    int n_len;

    for (n_buf = 0;n_buf < gen_nb_xmlBufferPtr;n_buf++) {
    for (n_str = 0;n_str < gen_nb_const_xmlChar_ptr;n_str++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
        mem_base = xmlMemBlocks();
        buf = gen_xmlBufferPtr(n_buf, 0);
        str = gen_const_xmlChar_ptr(n_str, 1);
        len = gen_int(n_len, 2);
        if ((str != NULL) &&
            (len > xmlStrlen(BAD_CAST str)))
            len = 0;

        ret_val = xmlBufferAddHead(buf, str, len);
        desret_int(ret_val);
        call_tests++;
        des_xmlBufferPtr(n_buf, buf, 0);
        des_const_xmlChar_ptr(n_str, str, 1);
        des_int(n_len, len, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlBufferAddHead",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_buf);
            printf(" %d", n_str);
            printf(" %d", n_len);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}